

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::ignore_underscore(string *__return_storage_ptr__,string *item)

{
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,item);
  detail::remove_underscore(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ignore_underscore(std::string item) { return detail::remove_underscore(item); }